

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RippleOP.cpp
# Opt level: O2

void __thiscall OpenMD::RippleOP::writeP2(RippleOP *this)

{
  ostream *poVar1;
  ofstream os;
  
  std::ofstream::ofstream
            ((ostream *)&os,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  poVar1 = std::operator<<((ostream *)&os,"#selection1: (");
  poVar1 = std::operator<<(poVar1,(string *)&this->selectionScript1_);
  std::operator<<(poVar1,")\n");
  std::operator<<((ostream *)&os,"#p2\terror\tdirector_x\tdirector_y\tdiretor_z\n");
  poVar1 = std::ostream::_M_insert<double>((this->avgOPHeadUpper).p2);
  std::operator<<(poVar1,"\t");
  poVar1 = std::ostream::_M_insert<double>((this->errOPHeadUpper).p2);
  std::operator<<(poVar1,"\t");
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPHeadUpper).director.super_Vector<double,_3U>.data_[0]);
  std::operator<<(poVar1,"\t");
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPHeadUpper).director.super_Vector<double,_3U>.data_[1]);
  std::operator<<(poVar1,"\t");
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPHeadUpper).director.super_Vector<double,_3U>.data_[2]);
  std::operator<<(poVar1,"\n");
  poVar1 = std::ostream::_M_insert<double>((this->avgOPHeadLower).p2);
  std::operator<<(poVar1,"\t");
  poVar1 = std::ostream::_M_insert<double>((this->errOPHeadLower).p2);
  std::operator<<(poVar1,"\t");
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPHeadLower).director.super_Vector<double,_3U>.data_[0]);
  std::operator<<(poVar1,"\t");
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPHeadLower).director.super_Vector<double,_3U>.data_[1]);
  std::operator<<(poVar1,"\t");
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPHeadLower).director.super_Vector<double,_3U>.data_[2]);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&os,"selection2: (");
  poVar1 = std::operator<<(poVar1,(string *)&this->selectionScript2_);
  std::operator<<(poVar1,")\n");
  std::operator<<((ostream *)&os,"#p2\terror\tdirector_x\tdirector_y\tdiretor_z\n");
  poVar1 = std::ostream::_M_insert<double>((this->avgOPTail).p2);
  std::operator<<(poVar1,"\t");
  poVar1 = std::ostream::_M_insert<double>((this->errOPTail).p2);
  std::operator<<(poVar1,"\t");
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPTail).director.super_Vector<double,_3U>.data_[0]);
  std::operator<<(poVar1,"\t");
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPTail).director.super_Vector<double,_3U>.data_[1]);
  std::operator<<(poVar1,"\t");
  poVar1 = std::ostream::_M_insert<double>
                     ((this->avgOPTail).director.super_Vector<double,_3U>.data_[2]);
  std::operator<<(poVar1,"\n");
  std::ofstream::~ofstream(&os);
  return;
}

Assistant:

void RippleOP::writeP2() {
    std::ofstream os(getOutputFileName().c_str());
    os << "#selection1: (" << selectionScript1_ << ")\n";
    os << "#p2\terror\tdirector_x\tdirector_y\tdiretor_z\n";

    os << avgOPHeadUpper.p2 << "\t" << errOPHeadUpper.p2 << "\t"
       << avgOPHeadUpper.director[0] << "\t" << avgOPHeadUpper.director[1]
       << "\t" << avgOPHeadUpper.director[2] << "\n";

    os << avgOPHeadLower.p2 << "\t" << errOPHeadLower.p2 << "\t"
       << avgOPHeadLower.director[0] << "\t" << avgOPHeadLower.director[1]
       << "\t" << avgOPHeadLower.director[2] << "\n";

    os << "selection2: (" << selectionScript2_ << ")\n";
    os << "#p2\terror\tdirector_x\tdirector_y\tdiretor_z\n";

    os << avgOPTail.p2 << "\t" << errOPTail.p2 << "\t" << avgOPTail.director[0]
       << "\t" << avgOPTail.director[1] << "\t" << avgOPTail.director[2]
       << "\n";
  }